

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  sel_t sVar11;
  int64_t *piVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar7 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar7;
    }
    if (count + 0x3f < 0x40) {
      iVar7 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar8 = count;
          }
LAB_014840dd:
          uVar9 = uVar14;
          if (uVar14 < uVar8) {
            psVar3 = sel->sel_vector;
            uVar2 = ldata->lower;
            lVar5 = ldata->upper;
            psVar4 = true_sel->sel_vector;
            piVar12 = &rdata[uVar14].upper;
            do {
              uVar9 = uVar14;
              if (psVar3 != (sel_t *)0x0) {
                uVar9 = (ulong)psVar3[uVar14];
              }
              lVar6 = *piVar12;
              uVar10 = ((hugeint_t *)(piVar12 + -1))->lower;
              psVar4[iVar7] = (sel_t)uVar9;
              iVar7 = iVar7 + (uVar10 < uVar2 && lVar5 == lVar6 || lVar5 != lVar6 && lVar6 <= lVar5)
              ;
              uVar14 = uVar14 + 1;
              piVar12 = piVar12 + 2;
              uVar9 = uVar8;
            } while (uVar8 != uVar14);
          }
        }
        else {
          uVar2 = puVar1[uVar13];
          uVar8 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar8 = count;
          }
          uVar9 = uVar8;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_014840dd;
            uVar9 = uVar14;
            if (uVar14 < uVar8) {
              psVar3 = sel->sel_vector;
              psVar4 = true_sel->sel_vector;
              piVar12 = &rdata[uVar14].upper;
              uVar10 = 0;
              do {
                if (psVar3 == (sel_t *)0x0) {
                  sVar11 = (int)uVar14 + (int)uVar10;
                }
                else {
                  sVar11 = psVar3[uVar14 + uVar10];
                }
                if ((uVar2 >> (uVar10 & 0x3f) & 1) == 0) {
                  uVar9 = 0;
                }
                else {
                  lVar5 = ldata->upper;
                  lVar6 = *piVar12;
                  uVar9 = (ulong)(((hugeint_t *)(piVar12 + -1))->lower < ldata->lower &&
                                  lVar5 == lVar6 || lVar5 != lVar6 && lVar6 <= lVar5);
                }
                psVar4[iVar7] = sVar11;
                iVar7 = iVar7 + uVar9;
                uVar10 = uVar10 + 1;
                piVar12 = piVar12 + 2;
                uVar9 = uVar8;
              } while ((uVar14 - uVar8) + uVar10 != 0);
            }
          }
        }
        uVar13 = uVar13 + 1;
        uVar14 = uVar9;
      } while (uVar13 != count + 0x3f >> 6);
    }
  }
  else {
    iVar7 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,true,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}